

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::estimate_R_and_t(Epnp *this,double (*R) [3],double *t)

{
  double *pdVar1;
  double dVar2;
  Scalar *pSVar3;
  double *pdVar4;
  double *in_RDX;
  double *in_RSI;
  Epnp *in_RDI;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int j_5;
  int i_4;
  MatrixXd Abt_v_prime;
  double det;
  int j_4;
  int i_3;
  MatrixXd Abt_v;
  MatrixXd Abt_u;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  int j_3;
  double *pw_1;
  double *pc_1;
  int i_2;
  int j_2;
  int i_1;
  MatrixXd Abt;
  int j_1;
  int j;
  double *pw;
  double *pc;
  int i;
  double pw0 [3];
  double pc0 [3];
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  *in_stack_fffffffffffff948;
  SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *in_stack_fffffffffffff950
  ;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *this_00;
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  *in_stack_fffffffffffff958;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff960;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffff968;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffff970;
  dense_product_base<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0,_6>
  *in_stack_fffffffffffff980;
  MatrixType *in_stack_fffffffffffff988;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffff990;
  int local_510;
  int local_50c;
  int local_320;
  int local_31c;
  int local_c4;
  int local_b0;
  int local_a0;
  int local_9c;
  int local_78;
  int local_74;
  int local_5c;
  double local_58 [4];
  double local_38;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *local_30;
  double local_28;
  double *local_18;
  double *local_10;
  
  local_28 = 0.0;
  local_30 = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)0x0;
  local_38 = 0.0;
  local_58[2] = 0.0;
  local_58[1] = 0.0;
  local_58[0] = 0.0;
  for (local_5c = 0; local_5c < in_RDI->number_of_correspondences; local_5c = local_5c + 1) {
    pdVar1 = in_RDI->pcs;
    pdVar4 = in_RDI->pws;
    for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
      (&local_38)[local_74] = pdVar1[(long)(local_5c * 3) + (long)local_74] + (&local_38)[local_74];
      local_58[local_74] = pdVar4[(long)(local_5c * 3) + (long)local_74] + local_58[local_74];
    }
  }
  for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
    (&local_38)[local_78] = (&local_38)[local_78] / (double)in_RDI->number_of_correspondences;
    local_58[local_78] = local_58[local_78] / (double)in_RDI->number_of_correspondences;
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (in_stack_fffffffffffff970,(int *)in_stack_fffffffffffff968,
             (int *)in_stack_fffffffffffff960);
  for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
    for (local_a0 = 0; local_a0 < 3; local_a0 = local_a0 + 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffff950,(Index)in_stack_fffffffffffff948,0x910666);
      *pSVar3 = 0.0;
    }
  }
  for (local_b0 = 0; local_b0 < in_RDI->number_of_correspondences; local_b0 = local_b0 + 1) {
    pdVar1 = in_RDI->pcs;
    pdVar4 = in_RDI->pws + local_b0 * 3;
    for (local_c4 = 0; local_c4 < 3; local_c4 = local_c4 + 1) {
      dVar6 = pdVar1[(long)(local_b0 * 3) + (long)local_c4];
      dVar5 = (&local_38)[local_c4];
      dVar2 = *pdVar4 - local_58[0];
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffff950,(Index)in_stack_fffffffffffff948,0x91079c);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar6 - dVar5;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar2;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *pSVar3;
      auVar10 = vfmadd213sd_fma(auVar7,auVar15,auVar21);
      *pSVar3 = auVar10._0_8_;
      dVar6 = pdVar1[(long)(local_b0 * 3) + (long)local_c4];
      dVar5 = (&local_38)[local_c4];
      dVar2 = pdVar4[1] - local_58[1];
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffff950,(Index)in_stack_fffffffffffff948,0x91081b);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar6 - dVar5;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar2;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *pSVar3;
      auVar10 = vfmadd213sd_fma(auVar8,auVar16,auVar22);
      *pSVar3 = auVar10._0_8_;
      in_stack_fffffffffffff980 =
           (dense_product_base<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0,_6>
            *)(pdVar1[(long)(local_b0 * 3) + (long)local_c4] - (&local_38)[local_c4]);
      in_stack_fffffffffffff988 = (MatrixType *)(pdVar4[2] - local_58[2]);
      in_stack_fffffffffffff990 =
           (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      in_stack_fffffffffffff950,(Index)in_stack_fffffffffffff948,0x91089a);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = in_stack_fffffffffffff980;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = in_stack_fffffffffffff988;
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           (in_stack_fffffffffffff990->
           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>).m_matrixU.
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar10 = vfmadd213sd_fma(auVar9,auVar17,auVar23);
      (in_stack_fffffffffffff990->
      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>).m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           auVar10._0_8_;
    }
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
             (uint)((ulong)in_stack_fffffffffffff980 >> 0x20));
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            (in_stack_fffffffffffff950);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&in_stack_fffffffffffff950->m_matrixU,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff948);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_fffffffffffff950);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&in_stack_fffffffffffff950->m_matrixU,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff948);
  for (local_31c = 0; local_31c < 3; local_31c = local_31c + 1) {
    for (local_320 = 0; local_320 < 3; local_320 = local_320 + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (in_stack_fffffffffffff960,(Index)in_stack_fffffffffffff958);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (in_stack_fffffffffffff960,(Index)in_stack_fffffffffffff958);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
      transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
                in_stack_fffffffffffff950);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
      in_stack_fffffffffffff968 =
           (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
           Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_fffffffffffff980);
      local_10[(long)local_31c * 3 + (long)local_320] = (double)in_stack_fffffffffffff968;
    }
  }
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_10[8];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *local_10 * local_10[4];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_10[1] * local_10[5] * local_10[6];
  auVar10 = vfmadd213sd_fma(auVar18,auVar10,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_10[7];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_10[2] * local_10[3];
  auVar10 = vfmadd213sd_fma(auVar25,auVar11,auVar10);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_10[6];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = -(local_10[2] * local_10[4]);
  auVar10 = vfmadd213sd_fma(auVar19,auVar12,auVar10);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_10[8];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = -(local_10[1] * local_10[3]);
  auVar10 = vfmadd213sd_fma(auVar26,auVar13,auVar10);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_10[7];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = -(*local_10 * local_10[5]);
  auVar10 = vfmadd213sd_fma(auVar14,auVar20,auVar10);
  if (auVar10._0_8_ < 0.0) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              (&in_stack_fffffffffffff950->m_matrixU,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff948);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffff960,(Index)in_stack_fffffffffffff958);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
    operator-(in_stack_fffffffffffff968);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffff960,(Index)in_stack_fffffffffffff958);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    for (local_50c = 0; local_50c < 3; local_50c = local_50c + 1) {
      for (local_510 = 0; local_510 < 3; local_510 = local_510 + 1) {
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (in_stack_fffffffffffff960,(Index)in_stack_fffffffffffff958);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (in_stack_fffffffffffff960,(Index)in_stack_fffffffffffff958);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
        transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                   *)in_stack_fffffffffffff950);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
        in_stack_fffffffffffff960 =
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_fffffffffffff980)
        ;
        local_10[(long)local_50c * 3 + (long)local_510] = (double)in_stack_fffffffffffff960;
      }
    }
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x910ddc)
    ;
  }
  dVar6 = local_38;
  dVar5 = dot(in_RDI,local_10,local_58);
  *local_18 = dVar6 - dVar5;
  this_00 = local_30;
  dVar6 = dot(in_RDI,local_10 + 3,local_58);
  local_18[1] = (double)this_00 - dVar6;
  dVar6 = local_28;
  dVar5 = dot(in_RDI,local_10 + 6,local_58);
  local_18[2] = dVar6 - dVar5;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x910ec3);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x910ed0);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this_00);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x910eea);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::estimate_R_and_t(
    double R[3][3],
    double t[3])
{
  double pc0[3], pw0[3];

  pc0[0] = pc0[1] = pc0[2] = 0.0;
  pw0[0] = pw0[1] = pw0[2] = 0.0;

  for(int i = 0; i < number_of_correspondences; i++)
  {
    const double * pc = pcs + 3 * i;
    const double * pw = pws + 3 * i;

    for(int j = 0; j < 3; j++)
    {
      pc0[j] += pc[j];
      pw0[j] += pw[j];
    }
  }
  for(int j = 0; j < 3; j++)
  {
    pc0[j] /= number_of_correspondences;
    pw0[j] /= number_of_correspondences;
  }

  Eigen::MatrixXd Abt(3,3);

  for(int i = 0; i < 3; i++)
  {
    for(int j = 0; j < 3; j++)
      Abt(i,j) = 0.0;
  }

  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * pc = pcs + 3 * i;
    double * pw = pws + 3 * i;

    for(int j = 0; j < 3; j++)
    {
      Abt(j,0) += (pc[j] - pc0[j]) * (pw[0] - pw0[0]);
      Abt(j,1) += (pc[j] - pc0[j]) * (pw[1] - pw0[1]);
      Abt(j,2) += (pc[j] - pc0[j]) * (pw[2] - pw0[2]);
    }
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      Abt,
      Eigen::ComputeFullV | Eigen::ComputeFullU );
  Eigen::MatrixXd Abt_u = SVD.matrixU();
  Eigen::MatrixXd Abt_v = SVD.matrixV();

  for(int i = 0; i < 3; i++)
    for(int j = 0; j < 3; j++)
      R[i][j] = Abt_u.row(i) * Abt_v.row(j).transpose();

  const double det =
      R[0][0] * R[1][1] * R[2][2] +
      R[0][1] * R[1][2] * R[2][0] +
      R[0][2] * R[1][0] * R[2][1] -
      R[0][2] * R[1][1] * R[2][0] -
      R[0][1] * R[1][0] * R[2][2] -
      R[0][0] * R[1][2] * R[2][1];

  //change 1: negative determinant problem is solved by changing Abt_v, not R

  if (det < 0)
  {
    //R[2][0] = -R[2][0];
    //R[2][1] = -R[2][1];
    //R[2][2] = -R[2][2];
    Eigen::MatrixXd Abt_v_prime = Abt_v;
    Abt_v_prime.col(2) = -Abt_v.col(2);
    for(int i = 0; i < 3; i++)
      for(int j = 0; j < 3; j++)
        R[i][j] = Abt_u.row(i) * Abt_v_prime.row(j).transpose();
  }

  t[0] = pc0[0] - dot(R[0], pw0);
  t[1] = pc0[1] - dot(R[1], pw0);
  t[2] = pc0[2] - dot(R[2], pw0);
}